

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O1

void Js::FunctionBody::ProfileSetNativeEntryPoint
               (FunctionEntryPointInfo *entryPointInfo,FunctionBody *functionBody,
               JavascriptMethod entryPoint)

{
  bool bVar1;
  undefined4 *puVar2;
  code *pcVar3;
  
  pcVar3 = entryPoint;
  if (((functionBody->super_ParseableFunctionInfo).super_FunctionProxy.field_0x46 & 8) == 0) {
    if (((functionBody->super_ParseableFunctionInfo).super_FunctionProxy.m_scriptContext)->
        CurrentThunk != ScriptContext::DebugProfileProbeThunk) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar2 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar2 = 1;
      bVar1 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                  ,0xf9a,
                                  "(functionBody->m_scriptContext->CurrentThunk == Js::ScriptContext::DebugProfileProbeThunk)"
                                  ,
                                  "functionBody->m_scriptContext->CurrentThunk == ProfileEntryThunk"
                                 );
      if (!bVar1) {
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      *puVar2 = 0;
    }
    pcVar3 = ScriptContext::DebugProfileProbeThunk;
  }
  SetNativeEntryPoint(functionBody,entryPointInfo,entryPoint,pcVar3);
  return;
}

Assistant:

void FunctionBody::ProfileSetNativeEntryPoint(FunctionEntryPointInfo* entryPointInfo, FunctionBody * functionBody, JavascriptMethod entryPoint)
    {
#ifdef ENABLE_WASM
        // Do not profile WebAssembly functions
        if (functionBody->IsWasmFunction())
        {
            functionBody->SetNativeEntryPoint(entryPointInfo, entryPoint, entryPoint);
            return;
        }
#endif
        Assert(functionBody->m_scriptContext->CurrentThunk == ProfileEntryThunk);
        functionBody->SetNativeEntryPoint(entryPointInfo, entryPoint, ProfileEntryThunk);
    }